

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bonk~.c
# Opt level: O2

void bonk_mask(t_bonk *x,t_floatarg f1,t_floatarg f2)

{
  int iVar1;
  t_float tVar2;
  
  tVar2 = 0.0;
  if ((0.0 <= f2) && (tVar2 = f2, 1.0 < f2)) {
    tVar2 = 1.0;
  }
  iVar1 = 0;
  if (0 < (int)f1) {
    iVar1 = (int)f1;
  }
  x->x_masktime = iVar1;
  x->x_maskdecay = tVar2;
  return;
}

Assistant:

static void bonk_mask(t_bonk *x, t_floatarg f1, t_floatarg f2)
{
    int ticks = f1;
    if (ticks < 0) ticks = 0;
    if (f2 < 0) f2 = 0;
    else if (f2 > 1) f2 = 1;
    x->x_masktime = ticks;
    x->x_maskdecay = f2;
}